

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

bool __thiscall
cmake::FindPackage(cmake *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *args)

{
  cmGlobalGenerator *this_00;
  __single_object this_01;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  string *psVar4;
  cmTarget *this_02;
  cmGeneratorTarget *this_03;
  cmLocalGenerator *this_04;
  char *__format;
  cmOutputConverter *outputConverter;
  string *lib;
  pointer lib_00;
  string_view arg;
  string_view arg_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  string includes;
  string includeFlags;
  __uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> local_210;
  string definitions;
  unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> local_1e8;
  __single_object mfu;
  string buildType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeDirs;
  string mode;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string frameworkPath;
  string linkPath;
  string packageName;
  string language;
  cmStateSnapshot snapshot;
  string linkFlags;
  string flags;
  string systemFile;
  
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeDirectory(this,&includes);
  std::__cxx11::string::~string((string *)&includes);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeOutputDirectory(this,&includes);
  std::__cxx11::string::~string((string *)&includes);
  includes._M_dataplus._M_p = (pointer)this;
  std::make_unique<cmGlobalGenerator,cmake*>((cmake **)&local_210);
  SetGlobalGenerator(this,(unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                          &local_210);
  if ((_Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
      local_210._M_t.
      super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
      super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl != (cmGlobalGenerator *)0x0) {
    (**(code **)(*(long *)local_210._M_t.
                          super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                          .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl + 8))();
  }
  local_210._M_t.
  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
  super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl =
       (tuple<cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)
       (_Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>)0x0;
  snapshot.Position.Position = (this->CurrentSnapshot).Position.Position;
  snapshot.State = (this->CurrentSnapshot).State;
  snapshot.Position.Tree = (this->CurrentSnapshot).Position.Tree;
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&includes,&snapshot);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmStateDirectory::SetCurrentBinary((cmStateDirectory *)&includes,&includeFlags);
  std::__cxx11::string::~string((string *)&includeFlags);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&includes,&snapshot);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmStateDirectory::SetCurrentSource((cmStateDirectory *)&includes,&includeFlags);
  std::__cxx11::string::~string((string *)&includeFlags);
  cmStateSnapshot::SetDefaultDefinitions(&snapshot);
  includes._M_dataplus._M_p =
       (pointer)(this->GlobalGenerator)._M_t.
                super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
  std::make_unique<cmMakefile,cmGlobalGenerator*,cmStateSnapshot&>
            ((cmGlobalGenerator **)&mfu,(cmStateSnapshot *)&includes);
  this_01 = mfu;
  local_1e8._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
  super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       mfu._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
       super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
       super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
  mfu._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
  super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
  super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmMakefile,_std::default_delete<cmMakefile>,_true,_true>)
       (__uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>)0x0;
  cmGlobalGenerator::AddMakefile
            ((this->GlobalGenerator)._M_t.
             super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
             super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,&local_1e8);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr(&local_1e8);
  cmMakefile::SetArgcArgv
            ((cmMakefile *)
             this_01._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,args);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&includes,"CMakeFindPackageMode.cmake",(allocator<char> *)&includeFlags);
  cmMakefile::GetModulesFile
            (&systemFile,
             (cmMakefile *)
             this_01._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&includes);
  std::__cxx11::string::~string((string *)&includes);
  cmMakefile::ReadListFile
            ((cmMakefile *)
             this_01._M_t.super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
             super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
             super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&systemFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&includes,"LANGUAGE",(allocator<char> *)&includeFlags);
  psVar4 = cmMakefile::GetSafeDefinition
                     ((cmMakefile *)
                      this_01._M_t.
                      super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                      super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                      super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&includes);
  std::__cxx11::string::string((string *)&language,(string *)psVar4);
  std::__cxx11::string::~string((string *)&includes);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&includes,"MODE",(allocator<char> *)&includeFlags);
  psVar4 = cmMakefile::GetSafeDefinition
                     ((cmMakefile *)
                      this_01._M_t.
                      super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                      super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                      super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&includes);
  std::__cxx11::string::string((string *)&mode,(string *)psVar4);
  std::__cxx11::string::~string((string *)&includes);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&includes,"NAME",(allocator<char> *)&includeFlags);
  psVar4 = cmMakefile::GetSafeDefinition
                     ((cmMakefile *)
                      this_01._M_t.
                      super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                      super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                      super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&includes);
  std::__cxx11::string::string((string *)&packageName,(string *)psVar4);
  std::__cxx11::string::~string((string *)&includes);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&includes,"PACKAGE_FOUND",(allocator<char> *)&includeFlags);
  bVar1 = cmMakefile::IsOn((cmMakefile *)
                           this_01._M_t.
                           super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                           super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&includes);
  std::__cxx11::string::~string((string *)&includes);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&includes,"PACKAGE_QUIET",(allocator<char> *)&includeFlags);
  bVar2 = cmMakefile::IsOn((cmMakefile *)
                           this_01._M_t.
                           super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
                           super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                           super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&includes);
  std::__cxx11::string::~string((string *)&includes);
  if (bVar1) {
    __y._M_str = "EXIST";
    __y._M_len = 5;
    __x._M_str = mode._M_dataplus._M_p;
    __x._M_len = mode._M_string_length;
    bVar3 = std::operator==(__x,__y);
    if (!bVar3) {
      __y_00._M_str = "COMPILE";
      __y_00._M_len = 7;
      __x_00._M_str = mode._M_dataplus._M_p;
      __x_00._M_len = mode._M_string_length;
      bVar2 = std::operator==(__x_00,__y_00);
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&includeFlags,"PACKAGE_INCLUDE_DIRS",(allocator<char> *)&definitions);
        psVar4 = cmMakefile::GetSafeDefinition
                           ((cmMakefile *)
                            this_01._M_t.
                            super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t
                            .super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                            super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&includeFlags);
        std::__cxx11::string::string((string *)&includes,(string *)psVar4);
        std::__cxx11::string::~string((string *)&includeFlags);
        arg._M_str = includes._M_dataplus._M_p;
        arg._M_len = includes._M_string_length;
        cmExpandedList_abi_cxx11_(&includeDirs,arg,false);
        cmGlobalGenerator::CreateGenerationObjects
                  ((this->GlobalGenerator)._M_t.
                   super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                   .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,AllTargets);
        definitions._M_dataplus._M_p = (pointer)&definitions.field_2;
        definitions._M_string_length = 0;
        definitions.field_2._M_local_buf[0] = '\0';
        cmLocalGenerator::GetIncludeFlags
                  (&includeFlags,
                   (cmLocalGenerator *)
                   **(undefined8 **)
                     &(((this->GlobalGenerator)._M_t.
                        super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                        .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl)->
                      LocalGenerators).
                      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                      ._M_impl,&includeDirs,(cmGeneratorTarget *)0x0,&language,&definitions,false);
        std::__cxx11::string::~string((string *)&definitions);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&buildType,"PACKAGE_DEFINITIONS",(allocator<char> *)&frameworkPath);
        psVar4 = cmMakefile::GetSafeDefinition
                           ((cmMakefile *)
                            this_01._M_t.
                            super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t
                            .super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
                            super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&buildType);
        std::__cxx11::string::string((string *)&definitions,(string *)psVar4);
        std::__cxx11::string::~string((string *)&buildType);
        printf("%s %s\n",includeFlags._M_dataplus._M_p,definitions._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&definitions);
        std::__cxx11::string::~string((string *)&includeFlags);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&includeDirs);
        std::__cxx11::string::~string((string *)&includes);
      }
      else {
        __y_01._M_str = "LINK";
        __y_01._M_len = 4;
        __x_01._M_str = mode._M_dataplus._M_p;
        __x_01._M_len = mode._M_string_length;
        bVar2 = std::operator==(__x_01,__y_01);
        if (bVar2) {
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&includes,"dummy",(allocator<char> *)&includeFlags);
          this_02 = cmMakefile::AddExecutable
                              ((cmMakefile *)
                               this_01._M_t.
                               super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                               .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&includes,
                               &srcs,true);
          std::__cxx11::string::~string((string *)&includes);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&includes,"LINKER_LANGUAGE",(allocator<char> *)&includeFlags);
          cmTarget::SetProperty(this_02,&includes,&language);
          std::__cxx11::string::~string((string *)&includes);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&includes,"PACKAGE_LIBRARIES",(allocator<char> *)&includeFlags);
          psVar4 = cmMakefile::GetSafeDefinition
                             ((cmMakefile *)
                              this_01._M_t.
                              super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                              .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&includes);
          std::__cxx11::string::string((string *)&definitions,(string *)psVar4);
          std::__cxx11::string::~string((string *)&includes);
          arg_00._M_str = definitions._M_dataplus._M_p;
          arg_00._M_len = definitions._M_string_length;
          cmExpandedList_abi_cxx11_(&libList,arg_00,false);
          for (lib_00 = libList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              lib_00 != libList.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish; lib_00 = lib_00 + 1) {
            cmTarget::AddLinkLibrary
                      (this_02,(cmMakefile *)
                               this_01._M_t.
                               super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                               .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,lib_00,
                       GENERAL_LibraryType);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&includes,"CMAKE_BUILD_TYPE",(allocator<char> *)&includeFlags);
          psVar4 = cmMakefile::GetSafeDefinition
                             ((cmMakefile *)
                              this_01._M_t.
                              super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>.
                              _M_t.
                              super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>
                              .super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl,&includes);
          std::__cxx11::string::string((string *)&buildType,(string *)psVar4);
          std::__cxx11::string::~string((string *)&includes);
          cmsys::SystemTools::UpperCase(&includes,&buildType);
          std::__cxx11::string::operator=((string *)&buildType,(string *)&includes);
          std::__cxx11::string::~string((string *)&includes);
          includeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)&includeDirs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          includeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          frameworkPath._M_dataplus._M_p = (pointer)&frameworkPath.field_2;
          frameworkPath._M_string_length = 0;
          linkPath._M_dataplus._M_p = (pointer)&linkPath.field_2;
          linkPath._M_string_length = 0;
          includeDirs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          frameworkPath.field_2._M_local_buf[0] = '\0';
          flags._M_dataplus._M_p = (pointer)&flags.field_2;
          flags._M_string_length = 0;
          linkFlags._M_dataplus._M_p = (pointer)&linkFlags.field_2;
          linkFlags._M_string_length = 0;
          linkPath.field_2._M_local_buf[0] = '\0';
          flags.field_2._M_local_buf[0] = '\0';
          linkFlags.field_2._M_local_buf[0] = '\0';
          cmGlobalGenerator::CreateGenerationObjects
                    ((this->GlobalGenerator)._M_t.
                     super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                     .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,AllTargets);
          this_00 = (this->GlobalGenerator)._M_t.
                    super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                    .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl;
          psVar4 = cmTarget::GetName_abi_cxx11_(this_02);
          this_03 = cmGlobalGenerator::FindGeneratorTarget(this_00,psVar4);
          this_04 = cmGeneratorTarget::GetLocalGenerator(this_03);
          outputConverter = &this_04->super_cmOutputConverter;
          if (this_04 == (cmLocalGenerator *)0x0) {
            outputConverter = (cmOutputConverter *)0x0;
          }
          cmLocalGenerator::GetStateSnapshot((cmStateSnapshot *)&local_148,this_04);
          cmStateSnapshot::GetDirectory
                    ((cmStateDirectory *)&includeFlags,(cmStateSnapshot *)&local_148);
          cmLinkLineComputer::cmLinkLineComputer
                    ((cmLinkLineComputer *)&includes,outputConverter,
                     (cmStateDirectory *)&includeFlags);
          cmLocalGenerator::GetTargetFlags
                    (this_04,(cmLinkLineComputer *)&includes,&buildType,(string *)&includeDirs,
                     &flags,&linkFlags,&frameworkPath,&linkPath,this_03);
          std::operator+(&local_148,&frameworkPath,&linkPath);
          std::operator+(&includeFlags,&local_148,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &includeDirs);
          std::__cxx11::string::operator=((string *)&includeDirs,(string *)&includeFlags);
          std::__cxx11::string::~string((string *)&includeFlags);
          std::__cxx11::string::~string((string *)&local_148);
          puts((char *)includeDirs.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
          cmLinkLineComputer::~cmLinkLineComputer((cmLinkLineComputer *)&includes);
          std::__cxx11::string::~string((string *)&linkFlags);
          std::__cxx11::string::~string((string *)&flags);
          std::__cxx11::string::~string((string *)&linkPath);
          std::__cxx11::string::~string((string *)&frameworkPath);
          std::__cxx11::string::~string((string *)&includeDirs);
          std::__cxx11::string::~string((string *)&buildType);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&libList);
          std::__cxx11::string::~string((string *)&definitions);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&srcs);
        }
      }
      goto LAB_001e4cb0;
    }
    if (bVar2) goto LAB_001e4cb0;
    __format = "%s found.\n";
  }
  else {
    if (bVar2) goto LAB_001e4cb0;
    __format = "%s not found.\n";
  }
  printf(__format,packageName._M_dataplus._M_p);
LAB_001e4cb0:
  std::__cxx11::string::~string((string *)&packageName);
  std::__cxx11::string::~string((string *)&mode);
  std::__cxx11::string::~string((string *)&language);
  std::__cxx11::string::~string((string *)&systemFile);
  std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::~unique_ptr(&mfu);
  return bVar1;
}

Assistant:

bool cmake::FindPackage(const std::vector<std::string>& args)
{
  this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

  this->SetGlobalGenerator(cm::make_unique<cmGlobalGenerator>(this));

  cmStateSnapshot snapshot = this->GetCurrentSnapshot();
  snapshot.GetDirectory().SetCurrentBinary(
    cmSystemTools::GetCurrentWorkingDirectory());
  snapshot.GetDirectory().SetCurrentSource(
    cmSystemTools::GetCurrentWorkingDirectory());
  // read in the list file to fill the cache
  snapshot.SetDefaultDefinitions();
  auto mfu = cm::make_unique<cmMakefile>(this->GetGlobalGenerator(), snapshot);
  cmMakefile* mf = mfu.get();
  this->GlobalGenerator->AddMakefile(std::move(mfu));

  mf->SetArgcArgv(args);

  std::string systemFile = mf->GetModulesFile("CMakeFindPackageMode.cmake");
  mf->ReadListFile(systemFile);

  std::string language = mf->GetSafeDefinition("LANGUAGE");
  std::string mode = mf->GetSafeDefinition("MODE");
  std::string packageName = mf->GetSafeDefinition("NAME");
  bool packageFound = mf->IsOn("PACKAGE_FOUND");
  bool quiet = mf->IsOn("PACKAGE_QUIET");

  if (!packageFound) {
    if (!quiet) {
      printf("%s not found.\n", packageName.c_str());
    }
  } else if (mode == "EXIST"_s) {
    if (!quiet) {
      printf("%s found.\n", packageName.c_str());
    }
  } else if (mode == "COMPILE"_s) {
    std::string includes = mf->GetSafeDefinition("PACKAGE_INCLUDE_DIRS");
    std::vector<std::string> includeDirs = cmExpandedList(includes);

    this->GlobalGenerator->CreateGenerationObjects();
    const auto& lg = this->GlobalGenerator->LocalGenerators[0];
    std::string includeFlags =
      lg->GetIncludeFlags(includeDirs, nullptr, language, std::string());

    std::string definitions = mf->GetSafeDefinition("PACKAGE_DEFINITIONS");
    printf("%s %s\n", includeFlags.c_str(), definitions.c_str());
  } else if (mode == "LINK"_s) {
    const char* targetName = "dummy";
    std::vector<std::string> srcs;
    cmTarget* tgt = mf->AddExecutable(targetName, srcs, true);
    tgt->SetProperty("LINKER_LANGUAGE", language);

    std::string libs = mf->GetSafeDefinition("PACKAGE_LIBRARIES");
    std::vector<std::string> libList = cmExpandedList(libs);
    for (std::string const& lib : libList) {
      tgt->AddLinkLibrary(*mf, lib, GENERAL_LibraryType);
    }

    std::string buildType = mf->GetSafeDefinition("CMAKE_BUILD_TYPE");
    buildType = cmSystemTools::UpperCase(buildType);

    std::string linkLibs;
    std::string frameworkPath;
    std::string linkPath;
    std::string flags;
    std::string linkFlags;
    this->GlobalGenerator->CreateGenerationObjects();
    cmGeneratorTarget* gtgt =
      this->GlobalGenerator->FindGeneratorTarget(tgt->GetName());
    cmLocalGenerator* lg = gtgt->GetLocalGenerator();
    cmLinkLineComputer linkLineComputer(lg,
                                        lg->GetStateSnapshot().GetDirectory());
    lg->GetTargetFlags(&linkLineComputer, buildType, linkLibs, flags,
                       linkFlags, frameworkPath, linkPath, gtgt);
    linkLibs = frameworkPath + linkPath + linkLibs;

    printf("%s\n", linkLibs.c_str());

    /*    if ( use_win32 )
          {
          tgt->SetProperty("WIN32_EXECUTABLE", "ON");
          }
        if ( use_macbundle)
          {
          tgt->SetProperty("MACOSX_BUNDLE", "ON");
          }*/
  }

  return packageFound;
}